

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

string * __thiscall
duckdb::Value::ToSQLString_abi_cxx11_(string *__return_storage_ptr__,Value *this)

{
  double dVar1;
  LogicalTypeId LVar2;
  bool bVar3;
  const_reference __rhs;
  vector<duckdb::Value,_true> *pvVar4;
  const_reference pvVar5;
  char *pcVar6;
  string *psVar7;
  idx_t i;
  ulong uVar8;
  string str_val;
  allocator local_fa;
  allocator local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  string local_98;
  child_list_t<LogicalType> *local_78;
  string local_70;
  string local_50;
  
  if (this->is_null == true) goto LAB_00291111;
  LVar2 = (this->type_).id_;
  switch(LVar2) {
  case DATE:
  case TIME:
  case TIMESTAMP_SEC:
  case TIMESTAMP_MS:
  case TIMESTAMP:
  case TIMESTAMP_NS:
  case BLOB:
  case INTERVAL:
  case TIMESTAMP_TZ:
  case TIME_TZ:
switchD_00291146_caseD_f:
    ToString_abi_cxx11_(&local_98,this);
    ::std::operator+(&local_d8,"\'",&local_98);
    ::std::operator+(&local_f8,&local_d8,"\'::");
    LogicalType::ToString_abi_cxx11_(&local_b8,&this->type_);
    ::std::operator+(__return_storage_ptr__,&local_f8,&local_b8);
    break;
  case FLOAT:
    if (((this->value_).uinteger & 0x7fffffff) < 0x7f800000) goto switchD_00291146_caseD_15;
    ToString_abi_cxx11_(&local_98,this);
    ::std::operator+(&local_d8,"\'",&local_98);
    ::std::operator+(&local_f8,&local_d8,"\'::");
    LogicalType::ToString_abi_cxx11_(&local_b8,&this->type_);
    ::std::operator+(__return_storage_ptr__,&local_f8,&local_b8);
    break;
  case DOUBLE:
    dVar1 = (this->value_).double_;
    if ((ulong)ABS(dVar1) < 0x7ff0000000000000) goto switchD_00291146_caseD_15;
    if (!NAN(dVar1)) {
      pcVar6 = "1e1000";
      if (dVar1 < 0.0) {
        pcVar6 = "-1e1000";
      }
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar6,(allocator *)&local_f8)
      ;
      return __return_storage_ptr__;
    }
    ToString_abi_cxx11_(&local_98,this);
    ::std::operator+(&local_d8,"\'",&local_98);
    ::std::operator+(&local_f8,&local_d8,"\'::");
    LogicalType::ToString_abi_cxx11_(&local_b8,&this->type_);
    ::std::operator+(__return_storage_ptr__,&local_f8,&local_b8);
    break;
  case VARCHAR:
switchD_00291146_caseD_19:
    ToString_abi_cxx11_(&local_f8,this);
    if ((local_f8._M_string_length == 1) && (*local_f8._M_dataplus._M_p == '\0')) {
      ::std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"chr(0)",(allocator *)&local_d8);
    }
    else {
      ToString_abi_cxx11_(&local_50,this);
      ::std::__cxx11::string::string((string *)&local_b8,"\'",&local_f9);
      ::std::__cxx11::string::string((string *)&local_70,"\'\'",&local_fa);
      StringUtil::Replace(&local_98,&local_50,&local_b8,&local_70);
      ::std::operator+(&local_d8,"\'",&local_98);
      ::std::operator+(__return_storage_ptr__,&local_d8,"\'");
      ::std::__cxx11::string::~string((string *)&local_d8);
      ::std::__cxx11::string::~string((string *)&local_98);
      ::std::__cxx11::string::~string((string *)&local_70);
      ::std::__cxx11::string::~string((string *)&local_b8);
      ::std::__cxx11::string::~string((string *)&local_50);
    }
    psVar7 = &local_f8;
    goto LAB_002911c5;
  default:
    switch(LVar2) {
    case STRUCT:
      bVar3 = StructType::IsUnnamed(&this->type_);
      pcVar6 = "{";
      if (bVar3) {
        pcVar6 = "(";
      }
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar6,(allocator *)&local_f8)
      ;
      local_78 = StructType::GetChildTypes_abi_cxx11_(&this->type_);
      pvVar4 = StructValue::GetChildren(this);
      for (uVar8 = 0;
          uVar8 < (ulong)((long)(pvVar4->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>
                                ).super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)(pvVar4->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>
                                ).super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 6); uVar8 = uVar8 + 1) {
        __rhs = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                ::get<true>(local_78,uVar8);
        pvVar5 = vector<duckdb::Value,_true>::get<true>(pvVar4,uVar8);
        if (bVar3) {
          ToSQLString_abi_cxx11_(&local_f8,pvVar5);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
          psVar7 = &local_f8;
        }
        else {
          ::std::operator+(&local_98,"\'",&__rhs->first);
          ::std::operator+(&local_d8,&local_98,"\': ");
          ToSQLString_abi_cxx11_(&local_b8,pvVar5);
          ::std::operator+(&local_f8,&local_d8,&local_b8);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
          ::std::__cxx11::string::~string((string *)&local_f8);
          ::std::__cxx11::string::~string((string *)&local_b8);
          ::std::__cxx11::string::~string((string *)&local_d8);
          psVar7 = &local_98;
        }
        ::std::__cxx11::string::~string((string *)psVar7);
        if (uVar8 < ((long)(pvVar4->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)(pvVar4->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl
                           .super__Vector_impl_data._M_start >> 6) - 1U) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    case LIST:
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"[",(allocator *)&local_f8);
      pvVar4 = ListValue::GetChildren(this);
      for (uVar8 = 0;
          uVar8 < (ulong)((long)(pvVar4->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>
                                ).super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)(pvVar4->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>
                                ).super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 6); uVar8 = uVar8 + 1) {
        pvVar5 = vector<duckdb::Value,_true>::get<true>(pvVar4,uVar8);
        ToSQLString_abi_cxx11_(&local_f8,pvVar5);
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        ::std::__cxx11::string::~string((string *)&local_f8);
        if (uVar8 < ((long)(pvVar4->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)(pvVar4->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl
                           .super__Vector_impl_data._M_start >> 6) - 1U) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    case MAP:
    case TABLE:
    case AGGREGATE_STATE:
    case LAMBDA:
    case UNION:
      break;
    case ENUM:
      goto switchD_00291146_caseD_19;
    case ARRAY:
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"[",(allocator *)&local_f8);
      pvVar4 = ArrayValue::GetChildren(this);
      for (uVar8 = 0;
          uVar8 < (ulong)((long)(pvVar4->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>
                                ).super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)(pvVar4->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>
                                ).super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 6); uVar8 = uVar8 + 1) {
        pvVar5 = vector<duckdb::Value,_true>::get<true>(pvVar4,uVar8);
        ToSQLString_abi_cxx11_(&local_f8,pvVar5);
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        ::std::__cxx11::string::~string((string *)&local_f8);
        if (uVar8 < ((long)(pvVar4->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)(pvVar4->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl
                           .super__Vector_impl_data._M_start >> 6) - 1U) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    default:
      if (LVar2 == UUID) goto switchD_00291146_caseD_f;
    }
  case DECIMAL:
  case CHAR:
  case UTINYINT:
  case USMALLINT:
  case UINTEGER:
  case UBIGINT:
  case TIMESTAMP_TZ|SQLNULL:
switchD_00291146_caseD_15:
LAB_00291111:
    ToString_abi_cxx11_(__return_storage_ptr__,this);
    return __return_storage_ptr__;
  }
  ::std::__cxx11::string::~string((string *)&local_b8);
  ::std::__cxx11::string::~string((string *)&local_f8);
  ::std::__cxx11::string::~string((string *)&local_d8);
  psVar7 = &local_98;
LAB_002911c5:
  ::std::__cxx11::string::~string((string *)psVar7);
  return __return_storage_ptr__;
}

Assistant:

string Value::ToSQLString() const {
	if (IsNull()) {
		return ToString();
	}
	switch (type_.id()) {
	case LogicalTypeId::UUID:
	case LogicalTypeId::DATE:
	case LogicalTypeId::TIME:
	case LogicalTypeId::TIMESTAMP:
	case LogicalTypeId::TIME_TZ:
	case LogicalTypeId::TIMESTAMP_TZ:
	case LogicalTypeId::TIMESTAMP_SEC:
	case LogicalTypeId::TIMESTAMP_MS:
	case LogicalTypeId::TIMESTAMP_NS:
	case LogicalTypeId::INTERVAL:
	case LogicalTypeId::BLOB:
		return "'" + ToString() + "'::" + type_.ToString();
	case LogicalTypeId::VARCHAR:
	case LogicalTypeId::ENUM: {
		auto str_val = ToString();
		if (str_val.size() == 1 && str_val[0] == '\0') {
			return "chr(0)";
		}
		return "'" + StringUtil::Replace(ToString(), "'", "''") + "'";
	}
	case LogicalTypeId::STRUCT: {
		bool is_unnamed = StructType::IsUnnamed(type_);
		string ret = is_unnamed ? "(" : "{";
		auto &child_types = StructType::GetChildTypes(type_);
		auto &struct_values = StructValue::GetChildren(*this);
		for (idx_t i = 0; i < struct_values.size(); i++) {
			auto &name = child_types[i].first;
			auto &child = struct_values[i];
			if (is_unnamed) {
				ret += child.ToSQLString();
			} else {
				ret += "'" + name + "': " + child.ToSQLString();
			}
			if (i < struct_values.size() - 1) {
				ret += ", ";
			}
		}
		ret += is_unnamed ? ")" : "}";
		return ret;
	}
	case LogicalTypeId::FLOAT:
		if (!FloatIsFinite(FloatValue::Get(*this))) {
			return "'" + ToString() + "'::" + type_.ToString();
		}
		return ToString();
	case LogicalTypeId::DOUBLE: {
		double val = DoubleValue::Get(*this);
		if (!DoubleIsFinite(val)) {
			if (!Value::IsNan(val)) {
				// to infinity and beyond
				return val < 0 ? "-1e1000" : "1e1000";
			}
			return "'" + ToString() + "'::" + type_.ToString();
		}
		return ToString();
	}
	case LogicalTypeId::LIST: {
		string ret = "[";
		auto &list_values = ListValue::GetChildren(*this);
		for (idx_t i = 0; i < list_values.size(); i++) {
			auto &child = list_values[i];
			ret += child.ToSQLString();
			if (i < list_values.size() - 1) {
				ret += ", ";
			}
		}
		ret += "]";
		return ret;
	}
	case LogicalTypeId::ARRAY: {
		string ret = "[";
		auto &array_values = ArrayValue::GetChildren(*this);
		for (idx_t i = 0; i < array_values.size(); i++) {
			auto &child = array_values[i];
			ret += child.ToSQLString();
			if (i < array_values.size() - 1) {
				ret += ", ";
			}
		}
		ret += "]";
		return ret;
	}
	default:
		return ToString();
	}
}